

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool __thiscall
CLIntercept::overrideGetDeviceInfo
          (CLIntercept *this,cl_device_id device,cl_device_info param_name,size_t param_value_size,
          void *param_value,size_t *param_value_size_ret,cl_int *errorCode)

{
  bool bVar1;
  cl_int cVar2;
  char *pcVar3;
  ulong uVar4;
  cl_icd_dispatch *pcVar5;
  size_t in_RCX;
  int in_EDX;
  cl_device_id in_RSI;
  CLIntercept *in_RDI;
  unsigned_long *in_R8;
  size_t *in_R9;
  byte bVar6;
  int *in_stack_00000008;
  cl_semaphore_type_khr type;
  cl_semaphore_type_khr *ptr_25;
  cl_device_unified_shared_memory_capabilities_intel *ptr_24;
  cl_device_svm_capabilities svmCaps;
  cl_device_unified_shared_memory_capabilities_intel sysSharedCaps;
  cl_device_unified_shared_memory_capabilities_intel cdSharedCaps;
  cl_device_unified_shared_memory_capabilities_intel sdSharedCaps;
  cl_device_unified_shared_memory_capabilities_intel deviceCaps;
  cl_device_unified_shared_memory_capabilities_intel hostCaps;
  cl_bitfield cato;
  cl_bitfield cacc;
  cl_bitfield ato;
  cl_bitfield acc;
  char *ptr_23;
  cl_name_version_khr *ptr_22;
  char *deviceBuiltInKernels;
  cl_name_version_khr *ptr_21;
  char *deviceILs;
  cl_name_version_khr *ptr_20;
  char *tempDeviceExtensions;
  string deviceExtensions_1;
  cl_version_khr version_1;
  cl_version_khr *ptr_19;
  size_t minor_1;
  size_t major_1;
  char *deviceOpenCLCVersion;
  cl_version_khr version;
  cl_version_khr *ptr_18;
  size_t minor;
  size_t major;
  char *deviceVersion;
  cl_uint *ptr_17;
  cl_uint *ptr_16;
  cl_uint *ptr_15;
  cl_uint *ptr_14;
  cl_uint *ptr_13;
  cl_uint *ptr_12;
  cl_uint *ptr_11;
  cl_uint *ptr_10;
  cl_uint *ptr_9;
  char *ptr_8;
  char *ptr_7;
  char *ptr_6;
  char *ptr_5;
  char *ptr_4;
  char *ptr_3;
  cl_int errorCode_1;
  char *deviceExtensions;
  string newExtensions;
  char *ptr_2;
  char *ptr_1;
  cl_device_type d;
  cl_device_type *ptr;
  bool override;
  size_t *in_stack_fffffffffffffda0;
  size_t *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb4;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  char **in_stack_fffffffffffffdb8;
  CLIntercept *in_stack_fffffffffffffdc0;
  cl_device_info cVar7;
  cl_name_version_khr *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd4;
  undefined1 in_stack_fffffffffffffdd5;
  undefined1 in_stack_fffffffffffffdd6;
  undefined1 in_stack_fffffffffffffdd7;
  undefined4 in_stack_fffffffffffffde4;
  ulong local_208;
  unsigned_long local_200;
  unsigned_long local_1f8;
  unsigned_long local_1f0;
  unsigned_long local_1e8;
  unsigned_long local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  unsigned_long *local_1b8;
  unsigned_long *local_1b0;
  void *local_1a8;
  unsigned_long *local_1a0;
  void *local_198;
  unsigned_long *local_190;
  char *local_188;
  string local_180 [36];
  uint local_15c;
  unsigned_long *local_158;
  ulong local_150;
  ulong local_148;
  void *local_140;
  uint local_134;
  unsigned_long *local_130;
  ulong local_128;
  ulong local_120;
  void *local_118;
  unsigned_long *local_c8;
  unsigned_long *local_c0;
  unsigned_long *local_b8;
  unsigned_long *local_b0;
  unsigned_long *local_a8;
  unsigned_long *local_a0;
  cl_int local_94;
  char *local_90;
  string local_78 [32];
  unsigned_long *local_58;
  unsigned_long *local_50;
  ulong local_48;
  byte local_31;
  size_t *local_30;
  unsigned_long *local_28;
  size_t local_20;
  int local_14;
  cl_device_id local_10;
  
  local_31 = 0;
  if (in_EDX == 0x1000) {
    bVar6 = (in_RDI->m_Config).DeviceType != 0;
    if ((bool)bVar6) {
      local_48 = (ulong)(in_RDI->m_Config).DeviceType;
      cVar2 = writeParamToMemory<unsigned_long>(in_RDI,in_RCX,local_48,in_R9,in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x1001) {
    bVar6 = (in_RDI->m_Config).DeviceVendorID != 0;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DeviceVendorID,in_R9,(uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x1002) {
    bVar6 = (in_RDI->m_Config).DeviceMaxComputeUnits != 0;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DeviceMaxComputeUnits,in_R9,(uint *)in_R8)
      ;
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x1006) {
    bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthChar != 0xffffffff;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthChar,in_R9,
                         (uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x1007) {
    bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthShort != 0xffffffff;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthShort,in_R9,
                         (uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x1008) {
    bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthInt != 0xffffffff;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthInt,in_R9,
                         (uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x1009) {
    bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthLong != 0xffffffff;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthLong,in_R9,
                         (uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x100a) {
    bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthFloat != 0xffffffff;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthFloat,in_R9,
                         (uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else if (in_EDX == 0x100b) {
    bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthDouble != 0xffffffff;
    if ((bool)bVar6) {
      cVar2 = writeParamToMemory<unsigned_int>
                        (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthDouble,in_R9,
                         (uint *)in_R8);
      *in_stack_00000008 = cVar2;
    }
  }
  else {
    local_28 = in_R8;
    if (in_EDX == 0x102b) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_50 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else if (in_EDX == 0x102c) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_a8 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else if (in_EDX == 0x102d) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_1b8 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else if (in_EDX == 0x102e) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_b0 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else if (in_EDX == 0x102f) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_b8 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else if (in_EDX == 0x1030) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_58 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
      else {
        uVar4 = std::__cxx11::string::empty();
        if (((((uVar4 & 1) == 0) ||
             (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0)) ||
            (((in_RDI->m_Config).Emulate_cl_khr_semaphore & 1U) != 0)) ||
           (bVar6 = local_31, ((in_RDI->m_Config).Emulate_cl_intel_unified_shared_memory & 1U) != 0)
           ) {
          std::__cxx11::string::string
                    (local_78,(string *)&(in_RDI->m_Config).PrependDeviceExtensions);
          uVar4 = std::__cxx11::string::empty();
          if (((uVar4 & 1) == 0) && (pcVar3 = (char *)std::__cxx11::string::back(), *pcVar3 != ' '))
          {
            std::__cxx11::string::push_back((char)local_78);
          }
          if ((((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) &&
             (in_stack_fffffffffffffdd7 =
                   checkDeviceForExtension
                             ((CLIntercept *)CONCAT44(in_stack_fffffffffffffde4,in_EDX),
                              (cl_device_id)in_RDI,
                              (char *)CONCAT17(in_stack_fffffffffffffdd7,
                                               CONCAT16(in_stack_fffffffffffffdd6,
                                                        CONCAT15(in_stack_fffffffffffffdd5,
                                                                 CONCAT14(in_stack_fffffffffffffdd4,
                                                                          in_stack_fffffffffffffdd0)
                                                                )))),
             !(bool)in_stack_fffffffffffffdd7)) {
            std::__cxx11::string::operator+=(local_78,"cl_khr_extended_versioning ");
          }
          if ((((in_RDI->m_Config).Emulate_cl_khr_semaphore & 1U) != 0) &&
             (in_stack_fffffffffffffdd6 =
                   checkDeviceForExtension
                             ((CLIntercept *)CONCAT44(in_stack_fffffffffffffde4,in_EDX),
                              (cl_device_id)in_RDI,
                              (char *)CONCAT17(in_stack_fffffffffffffdd7,
                                               CONCAT16(in_stack_fffffffffffffdd6,
                                                        CONCAT15(in_stack_fffffffffffffdd5,
                                                                 CONCAT14(in_stack_fffffffffffffdd4,
                                                                          in_stack_fffffffffffffdd0)
                                                                )))),
             !(bool)in_stack_fffffffffffffdd6)) {
            std::__cxx11::string::operator+=(local_78,"cl_khr_semaphore ");
          }
          if ((((in_RDI->m_Config).Emulate_cl_intel_unified_shared_memory & 1U) != 0) &&
             (in_stack_fffffffffffffdd5 =
                   checkDeviceForExtension
                             ((CLIntercept *)CONCAT44(in_stack_fffffffffffffde4,in_EDX),
                              (cl_device_id)in_RDI,
                              (char *)CONCAT17(in_stack_fffffffffffffdd7,
                                               CONCAT16(in_stack_fffffffffffffdd6,
                                                        CONCAT15(in_stack_fffffffffffffdd5,
                                                                 CONCAT14(in_stack_fffffffffffffdd4,
                                                                          in_stack_fffffffffffffdd0)
                                                                )))),
             !(bool)in_stack_fffffffffffffdd5)) {
            std::__cxx11::string::operator+=(local_78,"cl_intel_unified_shared_memory ");
          }
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            local_90 = (char *)0x0;
            local_94 = allocateAndGetDeviceInfoString
                                 ((CLIntercept *)
                                  CONCAT17(in_stack_fffffffffffffdd7,
                                           CONCAT16(in_stack_fffffffffffffdd6,
                                                    CONCAT15(in_stack_fffffffffffffdd5,
                                                             CONCAT14(in_stack_fffffffffffffdd4,
                                                                      in_stack_fffffffffffffdd0)))),
                                  (cl_device_id)in_stack_fffffffffffffdc8,
                                  (cl_device_info)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                                  in_stack_fffffffffffffdb8);
            if ((local_94 == 0) && (local_90 != (char *)0x0)) {
              std::__cxx11::string::operator+=(local_78,local_90);
              local_a0 = local_28;
              local_94 = writeStringToMemory(in_stack_fffffffffffffdc0,
                                             (size_t)in_stack_fffffffffffffdb8,
                                             (string *)
                                             CONCAT17(in_stack_fffffffffffffdb7,
                                                      CONCAT16(in_stack_fffffffffffffdb6,
                                                               CONCAT24(in_stack_fffffffffffffdb4,
                                                                        in_stack_fffffffffffffdb0)))
                                             ,in_stack_fffffffffffffda8,
                                             (char *)in_stack_fffffffffffffda0);
              local_31 = 1;
            }
            if (local_90 != (char *)0x0) {
              operator_delete__(local_90);
            }
          }
          std::__cxx11::string::~string(local_78);
          bVar6 = local_31;
        }
      }
    }
    else if (in_EDX == 0x1034) {
      bVar6 = (in_RDI->m_Config).DevicePreferredVectorWidthHalf != 0xffffffff;
      if ((bool)bVar6) {
        cVar2 = writeParamToMemory<unsigned_int>
                          (in_RDI,in_RCX,(in_RDI->m_Config).DevicePreferredVectorWidthHalf,in_R9,
                           (uint *)in_R8);
        *in_stack_00000008 = cVar2;
      }
    }
    else if (in_EDX == 0x103d) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_c0 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else if (in_EDX == 0x105b) {
      uVar4 = std::__cxx11::string::empty();
      bVar6 = local_31;
      if ((uVar4 & 1) == 0) {
        local_c8 = local_28;
        cVar2 = writeStringToMemory(in_stack_fffffffffffffdc0,(size_t)in_stack_fffffffffffffdb8,
                                    (string *)
                                    CONCAT17(in_stack_fffffffffffffdb7,
                                             CONCAT16(in_stack_fffffffffffffdb6,
                                                      CONCAT24(in_stack_fffffffffffffdb4,
                                                               in_stack_fffffffffffffdb0))),
                                    in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0);
        *in_stack_00000008 = cVar2;
        local_31 = 1;
        bVar6 = local_31;
      }
    }
    else {
      cVar7 = (cl_device_info)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
      bVar6 = local_31;
      local_30 = in_R9;
      local_20 = in_RCX;
      if (in_EDX == 0x105e) {
        if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
          local_118 = (void *)0x0;
          cVar2 = allocateAndGetDeviceInfoString
                            ((CLIntercept *)
                             CONCAT17(in_stack_fffffffffffffdd7,
                                      CONCAT16(in_stack_fffffffffffffdd6,
                                               CONCAT15(in_stack_fffffffffffffdd5,
                                                        CONCAT14(in_stack_fffffffffffffdd4,
                                                                 in_stack_fffffffffffffdd0)))),
                             (cl_device_id)in_stack_fffffffffffffdc8,cVar7,in_stack_fffffffffffffdb8
                            );
          *in_stack_00000008 = cVar2;
          if ((*in_stack_00000008 == 0) && (local_118 != (void *)0x0)) {
            local_120 = 0;
            local_128 = 0;
            bVar1 = getMajorMinorVersionFromString
                              (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                               (char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                CONCAT16(in_stack_fffffffffffffdb6,
                                                         CONCAT24(in_stack_fffffffffffffdb4,
                                                                  in_stack_fffffffffffffdb0))),
                               in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
            if (bVar1) {
              local_130 = local_28;
              local_134 = (uint)((local_120 & 0x3ff) << 0x16) | (uint)((local_128 & 0x3ff) << 0xc);
              cVar2 = writeParamToMemory<unsigned_int>
                                (in_RDI,local_20,local_134,local_30,(uint *)local_28);
              *in_stack_00000008 = cVar2;
              local_31 = 1;
            }
          }
          bVar6 = local_31;
          if (local_118 != (void *)0x0) {
            operator_delete__(local_118);
            bVar6 = local_31;
          }
        }
      }
      else if (in_EDX == 0x105f) {
        if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
          local_140 = (void *)0x0;
          cVar2 = allocateAndGetDeviceInfoString
                            ((CLIntercept *)
                             CONCAT17(in_stack_fffffffffffffdd7,
                                      CONCAT16(in_stack_fffffffffffffdd6,
                                               CONCAT15(in_stack_fffffffffffffdd5,
                                                        CONCAT14(in_stack_fffffffffffffdd4,
                                                                 in_stack_fffffffffffffdd0)))),
                             (cl_device_id)in_stack_fffffffffffffdc8,cVar7,in_stack_fffffffffffffdb8
                            );
          *in_stack_00000008 = cVar2;
          if ((*in_stack_00000008 == 0) && (local_140 != (void *)0x0)) {
            local_148 = 0;
            local_150 = 0;
            bVar1 = getMajorMinorVersionFromString
                              (in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                               (char *)CONCAT17(in_stack_fffffffffffffdb7,
                                                CONCAT16(in_stack_fffffffffffffdb6,
                                                         CONCAT24(in_stack_fffffffffffffdb4,
                                                                  in_stack_fffffffffffffdb0))),
                               in_stack_fffffffffffffda8,in_stack_fffffffffffffda0);
            if (bVar1) {
              local_158 = local_28;
              local_15c = (uint)((local_148 & 0x3ff) << 0x16) | (uint)((local_150 & 0x3ff) << 0xc);
              cVar2 = writeParamToMemory<unsigned_int>
                                (in_RDI,local_20,local_15c,local_30,(uint *)local_28);
              *in_stack_00000008 = cVar2;
              local_31 = 1;
            }
          }
          bVar6 = local_31;
          if (local_140 != (void *)0x0) {
            operator_delete__(local_140);
            bVar6 = local_31;
          }
        }
      }
      else if (in_EDX == 0x1060) {
        if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
          std::__cxx11::string::string(local_180);
          if ((((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) &&
             (bVar1 = checkDeviceForExtension
                                ((CLIntercept *)CONCAT44(in_stack_fffffffffffffde4,in_EDX),
                                 (cl_device_id)in_RDI,
                                 (char *)CONCAT17(in_stack_fffffffffffffdd7,
                                                  CONCAT16(in_stack_fffffffffffffdd6,
                                                           CONCAT15(in_stack_fffffffffffffdd5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffdd4,
                                                  in_stack_fffffffffffffdd0))))), !bVar1)) {
            std::__cxx11::string::operator+=(local_180,"cl_khr_extended_versioning ");
          }
          if ((((in_RDI->m_Config).Emulate_cl_intel_unified_shared_memory & 1U) != 0) &&
             (bVar1 = checkDeviceForExtension
                                ((CLIntercept *)CONCAT44(in_stack_fffffffffffffde4,in_EDX),
                                 (cl_device_id)in_RDI,
                                 (char *)CONCAT17(in_stack_fffffffffffffdd7,
                                                  CONCAT16(in_stack_fffffffffffffdd6,
                                                           CONCAT15(in_stack_fffffffffffffdd5,
                                                                    CONCAT14(
                                                  in_stack_fffffffffffffdd4,
                                                  in_stack_fffffffffffffdd0))))), !bVar1)) {
            std::__cxx11::string::operator+=(local_180,"cl_intel_unified_shared_memory ");
          }
          local_188 = (char *)0x0;
          allocateAndGetDeviceInfoString
                    ((CLIntercept *)
                     CONCAT17(in_stack_fffffffffffffdd7,
                              CONCAT16(in_stack_fffffffffffffdd6,
                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                         in_stack_fffffffffffffdd0)))),
                     (cl_device_id)in_stack_fffffffffffffdc8,
                     (cl_device_info)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                     in_stack_fffffffffffffdb8);
          std::__cxx11::string::operator+=(local_180,local_188);
          local_190 = local_28;
          std::__cxx11::string::c_str();
          cVar2 = parseExtensionString
                            ((char *)CONCAT17(in_stack_fffffffffffffdd7,
                                              CONCAT16(in_stack_fffffffffffffdd6,
                                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                                         in_stack_fffffffffffffdd0))
                                                      )),in_stack_fffffffffffffdc8,
                             (size_t)in_stack_fffffffffffffdc0,(size_t *)in_stack_fffffffffffffdb8);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          if (local_188 != (char *)0x0) {
            operator_delete__(local_188);
          }
          local_188 = (char *)0x0;
          std::__cxx11::string::~string(local_180);
          bVar6 = local_31;
        }
      }
      else if (in_EDX == 0x1061) {
        if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
          local_198 = (void *)0x0;
          allocateAndGetDeviceInfoString
                    ((CLIntercept *)
                     CONCAT17(in_stack_fffffffffffffdd7,
                              CONCAT16(in_stack_fffffffffffffdd6,
                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                         in_stack_fffffffffffffdd0)))),
                     (cl_device_id)in_stack_fffffffffffffdc8,cVar7,in_stack_fffffffffffffdb8);
          local_1a0 = local_28;
          cVar2 = parseILString((char *)CONCAT44(in_stack_fffffffffffffde4,in_EDX),
                                (cl_name_version_khr *)in_RDI,
                                CONCAT17(in_stack_fffffffffffffdd7,
                                         CONCAT16(in_stack_fffffffffffffdd6,
                                                  CONCAT15(in_stack_fffffffffffffdd5,
                                                           CONCAT14(in_stack_fffffffffffffdd4,
                                                                    in_stack_fffffffffffffdd0)))),
                                (size_t *)in_stack_fffffffffffffdc8);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
          if (local_198 != (void *)0x0) {
            operator_delete__(local_198);
            bVar6 = local_31;
          }
        }
      }
      else if (in_EDX == 0x1062) {
        if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
          local_1a8 = (void *)0x0;
          allocateAndGetDeviceInfoString
                    ((CLIntercept *)
                     CONCAT17(in_stack_fffffffffffffdd7,
                              CONCAT16(in_stack_fffffffffffffdd6,
                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                         in_stack_fffffffffffffdd0)))),
                     (cl_device_id)in_stack_fffffffffffffdc8,cVar7,in_stack_fffffffffffffdb8);
          local_1b0 = local_28;
          cVar2 = parseBuiltInKernelsString
                            ((char *)CONCAT17(in_stack_fffffffffffffdd7,
                                              CONCAT16(in_stack_fffffffffffffdd6,
                                                       CONCAT15(in_stack_fffffffffffffdd5,
                                                                CONCAT14(in_stack_fffffffffffffdd4,
                                                                         in_stack_fffffffffffffdd0))
                                                      )),in_stack_fffffffffffffdc8,
                             (size_t)in_stack_fffffffffffffdc0,(size_t *)in_stack_fffffffffffffdb8);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
          if (local_1a8 != (void *)0x0) {
            operator_delete__(local_1a8);
            bVar6 = local_31;
          }
        }
      }
      else if (in_EDX == 0x204c) {
        bVar6 = ((in_RDI->m_Config).Emulate_cl_khr_semaphore & 1U) != 0;
        if ((bool)bVar6) {
          cVar2 = writeParamToMemory<unsigned_int>(in_RDI,in_RCX,1,in_R9,(uint *)in_R8);
          *in_stack_00000008 = cVar2;
        }
      }
      else if ((in_EDX - 0x4190U < 5) &&
              (((in_RDI->m_Config).Emulate_cl_intel_unified_shared_memory & 1U) != 0)) {
        local_1c0 = 1;
        local_1c8 = 2;
        local_1d0 = 4;
        local_1d8 = 8;
        local_1e0 = 0;
        local_1e8 = 0;
        local_1f0 = 0;
        local_1f8 = 0;
        local_200 = 0;
        local_208 = 0;
        local_14 = in_EDX;
        local_10 = in_RSI;
        pcVar5 = dispatch(in_RDI);
        (*pcVar5->clGetDeviceInfo)(local_10,0x1053,8,&local_208,(size_t *)0x0);
        if ((local_208 & 4) == 0) {
          if ((local_208 & 2) == 0) {
            if ((local_208 & 1) != 0) {
              local_1e8 = 3;
            }
          }
          else {
            local_1e0 = 7;
            local_1e8 = 3;
            local_1f0 = 7;
            local_1f8 = 7;
            if ((local_208 & 8) != 0) {
              local_1e0 = 0xf;
              local_1e8 = 0xb;
              local_1f0 = 0xf;
              local_1f8 = 0xf;
            }
          }
        }
        else {
          local_1e0 = 7;
          local_1e8 = 3;
          local_1f0 = 7;
          local_1f8 = 7;
          local_200 = 7;
          if ((local_208 & 8) != 0) {
            local_1e0 = 0xf;
            local_1e8 = 0xb;
            local_1f0 = 0xf;
            local_1f8 = 0xf;
            local_200 = 0xf;
          }
        }
        bVar6 = local_31;
        switch(local_14) {
        case 0x4190:
          cVar2 = writeParamToMemory<unsigned_long>(in_RDI,local_20,local_1e0,local_30,local_28);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
          break;
        case 0x4191:
          cVar2 = writeParamToMemory<unsigned_long>(in_RDI,local_20,local_1e8,local_30,local_28);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
          break;
        case 0x4192:
          cVar2 = writeParamToMemory<unsigned_long>(in_RDI,local_20,local_1f0,local_30,local_28);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
          break;
        case 0x4193:
          cVar2 = writeParamToMemory<unsigned_long>(in_RDI,local_20,local_1f8,local_30,local_28);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
          break;
        case 0x4194:
          cVar2 = writeParamToMemory<unsigned_long>(in_RDI,local_20,local_200,local_30,local_28);
          *in_stack_00000008 = cVar2;
          local_31 = 1;
          bVar6 = local_31;
        }
      }
    }
  }
  local_31 = bVar6;
  return (bool)(local_31 & 1);
}

Assistant:

bool CLIntercept::overrideGetDeviceInfo(
    cl_device_id device,
    cl_device_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret,
    cl_int& errorCode ) const
{
    bool    override = false;

    switch( param_name )
    {
    case CL_DEVICE_TYPE:
        if( m_Config.DeviceType != 0 )
        {
            cl_device_type* ptr = (cl_device_type*)param_value;
            cl_device_type  d = m_Config.DeviceType;
            errorCode = writeParamToMemory(
                param_value_size,
                d,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_NAME:
        if( !m_Config.DeviceName.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceName,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_EXTENSIONS:
        if( !m_Config.DeviceExtensions.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceExtensions,
                param_value_size_ret,
                ptr );
            override = true;
        }
        else if( !m_Config.PrependDeviceExtensions.empty() ||
                 m_Config.Emulate_cl_khr_extended_versioning ||
                 m_Config.Emulate_cl_khr_semaphore ||
                 m_Config.Emulate_cl_intel_unified_shared_memory )
        {
            std::string newExtensions(m_Config.PrependDeviceExtensions);
            if( !newExtensions.empty() && newExtensions.back() != ' ' )
            {
                newExtensions.push_back(' ');
            }
            if( m_Config.Emulate_cl_khr_extended_versioning &&
                !checkDeviceForExtension( device, "cl_khr_extended_versioning") )
            {
                newExtensions += "cl_khr_extended_versioning ";
            }
            if( m_Config.Emulate_cl_khr_semaphore &&
                !checkDeviceForExtension( device, "cl_khr_semaphore") )
            {
                newExtensions += "cl_khr_semaphore ";
            }
            if( m_Config.Emulate_cl_intel_unified_shared_memory &&
                !checkDeviceForExtension( device, "cl_intel_unified_shared_memory") )
            {
                newExtensions += "cl_intel_unified_shared_memory ";
            }

            if( !newExtensions.empty() )
            {
                char*   deviceExtensions = NULL;
                cl_int  errorCode = allocateAndGetDeviceInfoString(
                    device,
                    CL_DEVICE_EXTENSIONS,
                    deviceExtensions );
                if( errorCode == CL_SUCCESS && deviceExtensions )
                {
                    newExtensions += deviceExtensions;

                    char*   ptr = (char*)param_value;
                    errorCode = writeStringToMemory(
                        param_value_size,
                        newExtensions,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
                delete [] deviceExtensions;
            }
        }
        break;
    case CL_DEVICE_VENDOR:
        if( !m_Config.DeviceVendor.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceVendor,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PROFILE:
        if( !m_Config.DeviceProfile.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceProfile,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_VERSION:
        if( !m_Config.DeviceVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_OPENCL_C_VERSION:
        if( !m_Config.DeviceCVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceCVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_IL_VERSION:
        if( !m_Config.DeviceILVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DeviceILVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_VENDOR_ID:
        if( m_Config.DeviceVendorID != 0 )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DeviceVendorID,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_MAX_COMPUTE_UNITS:
        if( m_Config.DeviceMaxComputeUnits != 0 )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DeviceMaxComputeUnits,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_CHAR:
        if( m_Config.DevicePreferredVectorWidthChar != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthChar,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_SHORT:
        if( m_Config.DevicePreferredVectorWidthShort != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthShort,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_INT:
        if( m_Config.DevicePreferredVectorWidthInt != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthInt,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_LONG:
        if( m_Config.DevicePreferredVectorWidthLong != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthLong,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_HALF:
        if( m_Config.DevicePreferredVectorWidthHalf != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthHalf,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_FLOAT:
        if( m_Config.DevicePreferredVectorWidthFloat != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthFloat,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_PREFERRED_VECTOR_WIDTH_DOUBLE:
        if( m_Config.DevicePreferredVectorWidthDouble != UINT_MAX )
        {
            cl_uint*    ptr = (cl_uint*)param_value;
            errorCode = writeParamToMemory(
                param_value_size,
                m_Config.DevicePreferredVectorWidthDouble,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceVersion = NULL;

            errorCode = allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_VERSION,
                deviceVersion );
            if( errorCode == CL_SUCCESS && deviceVersion )
            {
                // According to the spec, the device version string should have the form:
                //   OpenCL <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL ",
                        deviceVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] deviceVersion;
            deviceVersion = NULL;
        }
        break;
    case CL_DEVICE_OPENCL_C_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceOpenCLCVersion = NULL;

            errorCode = allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_OPENCL_C_VERSION,
                deviceOpenCLCVersion );
            if( errorCode == CL_SUCCESS && deviceOpenCLCVersion )
            {
                // According to the spec, the OpenCL C version string should have the form:
                //   OpenCL C <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL C ",
                        deviceOpenCLCVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] deviceOpenCLCVersion;
            deviceOpenCLCVersion = NULL;
        }
        break;
    case CL_DEVICE_EXTENSIONS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            std::string deviceExtensions;
            if( m_Config.Emulate_cl_khr_extended_versioning &&
                !checkDeviceForExtension( device, "cl_khr_extended_versioning") )
            {
                deviceExtensions += "cl_khr_extended_versioning ";
            }
            if( m_Config.Emulate_cl_intel_unified_shared_memory &&
                !checkDeviceForExtension( device, "cl_intel_unified_shared_memory") )
            {
                deviceExtensions += "cl_intel_unified_shared_memory ";
            }

            char*   tempDeviceExtensions = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_EXTENSIONS,
                tempDeviceExtensions );
            deviceExtensions += tempDeviceExtensions;

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero extensions are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseExtensionString(
                deviceExtensions.c_str(),
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] tempDeviceExtensions;
            tempDeviceExtensions = NULL;
        }
        break;
    case CL_DEVICE_ILS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceILs = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_IL_VERSION,
                deviceILs );

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero ILs are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseILString(
                deviceILs,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] deviceILs;
            deviceILs = NULL;
        }
        break;
    case CL_DEVICE_BUILT_IN_KERNELS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   deviceBuiltInKernels = NULL;

            allocateAndGetDeviceInfoString(
                device,
                CL_DEVICE_BUILT_IN_KERNELS,
                deviceBuiltInKernels );

            // Parse the built-in kernels string even if the query returned
            // an error.  In this case we will simply return that zero
            // built-in kernels are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseBuiltInKernelsString(
                deviceBuiltInKernels,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] deviceBuiltInKernels;
            deviceBuiltInKernels = NULL;
        }
        break;
    case CL_DRIVER_VERSION:
        if( !m_Config.DriverVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.DriverVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_DEVICE_HOST_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_DEVICE_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_SINGLE_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_CROSS_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
    case CL_DEVICE_SHARED_SYSTEM_MEM_CAPABILITIES_INTEL:
        if( m_Config.Emulate_cl_intel_unified_shared_memory )
        {
            // Shorthand:
            const cl_bitfield acc = CL_UNIFIED_SHARED_MEMORY_ACCESS_INTEL;
            const cl_bitfield ato = CL_UNIFIED_SHARED_MEMORY_ATOMIC_ACCESS_INTEL;
            const cl_bitfield cacc = CL_UNIFIED_SHARED_MEMORY_CONCURRENT_ACCESS_INTEL;
            const cl_bitfield cato = CL_UNIFIED_SHARED_MEMORY_CONCURRENT_ATOMIC_ACCESS_INTEL;

            // Caps:
            cl_device_unified_shared_memory_capabilities_intel hostCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel deviceCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel sdSharedCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel cdSharedCaps = 0;
            cl_device_unified_shared_memory_capabilities_intel sysSharedCaps = 0;

            cl_device_svm_capabilities svmCaps = 0;
            dispatch().clGetDeviceInfo(
                device,
                CL_DEVICE_SVM_CAPABILITIES,
                sizeof(svmCaps),
                &svmCaps,
                NULL );
            if( svmCaps & CL_DEVICE_SVM_FINE_GRAIN_SYSTEM )
            {
                //log( "Returning USM caps for: System SVM\n" );
                hostCaps =      acc | ato | cacc;
                deviceCaps =    acc | ato;
                sdSharedCaps =  acc | ato | cacc;
                cdSharedCaps =  acc | ato | cacc;
                sysSharedCaps = acc | ato | cacc;
                if( svmCaps & CL_DEVICE_SVM_ATOMICS )
                {
                    hostCaps |=      cato;
                    deviceCaps |=    cato;
                    sdSharedCaps |=  cato;
                    cdSharedCaps |=  cato;
                    sysSharedCaps |= cato;
                }
            }
            else if( svmCaps & CL_DEVICE_SVM_FINE_GRAIN_BUFFER )
            {
                //log( "Returning USM caps for: Fine Grain Buffer SVM\n" );
                hostCaps =      acc | ato | cacc;
                deviceCaps =    acc | ato;
                sdSharedCaps =  acc | ato | cacc;
                cdSharedCaps =  acc | ato | cacc;
                if( svmCaps & CL_DEVICE_SVM_ATOMICS )
                {
                    hostCaps |=     cato;
                    deviceCaps |=   cato;
                    sdSharedCaps |= cato;
                    cdSharedCaps |=   cato;
                }
            }
            else if( svmCaps & CL_DEVICE_SVM_COARSE_GRAIN_BUFFER )
            {
                //log( "Returning USM caps for: Coarse Grain Buffer SVM\n" );
                deviceCaps = acc | ato;
            }

            cl_device_unified_shared_memory_capabilities_intel*    ptr =
                (cl_device_unified_shared_memory_capabilities_intel*)param_value;

            switch( param_name )
            {
            case CL_DEVICE_HOST_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    hostCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_DEVICE_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    deviceCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_SINGLE_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    sdSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_CROSS_DEVICE_SHARED_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    cdSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            case CL_DEVICE_SHARED_SYSTEM_MEM_CAPABILITIES_INTEL:
                errorCode = writeParamToMemory(
                    param_value_size,
                    sysSharedCaps,
                    param_value_size_ret,
                    ptr );
                override = true;
                break;
            default:
                break;
            }
        }
        break;
    case CL_DEVICE_SEMAPHORE_TYPES_KHR:
        if( m_Config.Emulate_cl_khr_semaphore )
        {
            // If we decide to emulate multiple semaphore types we will need
            // to return an array, but for now we can return just the binary
            // semaphore type.
            auto    ptr = (cl_semaphore_type_khr*)param_value;
            cl_semaphore_type_khr type = CL_SEMAPHORE_TYPE_BINARY_KHR;
            errorCode = writeParamToMemory(
                param_value_size,
                type,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    default:
        break;
    }

    return override;
}